

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O0

bool spvExpandOperandSequenceOnce(spv_operand_type_t type,spv_operand_pattern_t *pattern)

{
  value_type local_30 [6];
  vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *local_18;
  spv_operand_pattern_t *pattern_local;
  spv_operand_type_t type_local;
  
  local_18 = pattern;
  pattern_local._0_4_ = type;
  switch(type) {
  case SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE:
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (pattern,(value_type *)&pattern_local);
    local_30[5] = 0x2a;
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (local_18,local_30 + 5);
    pattern_local._7_1_ = true;
    break;
  case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER:
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (pattern,(value_type *)&pattern_local);
    local_30[4] = 0x2d;
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (local_18,local_30 + 4);
    pattern_local._7_1_ = true;
    break;
  case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER_ID:
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (pattern,(value_type *)&pattern_local);
    local_30[3] = 1;
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (local_18,local_30 + 3);
    local_30[2] = 0x2f;
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (local_18,local_30 + 2);
    pattern_local._7_1_ = true;
    break;
  case SPV_OPERAND_TYPE_LAST_OPTIONAL_TYPE:
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (pattern,(value_type *)&pattern_local);
    local_30[1] = 6;
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (local_18,local_30 + 1);
    local_30[0] = SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE;
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (local_18,local_30);
    pattern_local._7_1_ = true;
    break;
  default:
    pattern_local._7_1_ = false;
  }
  return pattern_local._7_1_;
}

Assistant:

bool spvExpandOperandSequenceOnce(spv_operand_type_t type,
                                  spv_operand_pattern_t* pattern) {
  switch (type) {
    case SPV_OPERAND_TYPE_VARIABLE_ID:
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_ID);
      return true;
    case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER:
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER);
      return true;
    case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER_ID:
      // Represents Zero or more (Literal number, Id) pairs,
      // where the literal number must be a scalar integer.
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_ID);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER);
      return true;
    case SPV_OPERAND_TYPE_VARIABLE_ID_LITERAL_INTEGER:
      // Represents Zero or more (Id, Literal number) pairs.
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_LITERAL_INTEGER);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_ID);
      return true;
    default:
      break;
  }
  return false;
}